

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O2

bool __thiscall QDtls::setPeerVerificationName(QDtls *this,QString *name)

{
  long *plVar1;
  int iVar2;
  bool bVar3;
  long *plVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 == (long *)0x0) {
    bVar3 = false;
  }
  else {
    iVar2 = (**(code **)(*plVar1 + 0x90))(plVar1);
    plVar4 = (long *)(*(long *)(*plVar1 + -0x60) + (long)plVar1);
    if (iVar2 == 0) {
      (**(code **)(*plVar4 + 0x28))(plVar4);
      (**(code **)(*plVar1 + 0x70))(plVar1,name);
      bVar3 = true;
    }
    else {
      bVar3 = false;
      tr((QString *)&QStack_38,"Cannot set verification name after handshake started",(char *)0x0,-1
        );
      (**(code **)(*plVar4 + 0x10))(plVar4,2,&QStack_38);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::setPeerVerificationName(const QString &name)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (backend->state() != HandshakeNotStarted) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                        tr("Cannot set verification name after handshake started"));
        return false;
    }

    backend->clearDtlsError();
    backend->setPeerVerificationName(name);

    return true;
}